

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall
amrex::EB2::Level::fillFaceCent(Level *this,Array<MultiFab_*,_3> *a_facecent,Geometry *geom)

{
  bool bVar1;
  const_reference ppMVar2;
  undefined8 in_RDX;
  Level *in_RDI;
  Periodicity PVar3;
  int unaff_retaddr;
  Periodicity *in_stack_00000008;
  CpOp in_stack_00000010;
  MultiFab *facecent;
  int idim_1;
  int idim;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff80;
  int local_40;
  undefined8 this_00;
  undefined4 uVar4;
  undefined4 uVar5;
  
  for (uVar5 = 0; (int)uVar5 < 3; uVar5 = uVar5 + 1) {
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffff80,
               (value_type)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  bVar1 = isAllRegular(in_RDI);
  if (!bVar1) {
    for (uVar4 = 0; (int)uVar4 < 3; uVar4 = uVar4 + 1) {
      ppMVar2 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                          ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffff80,
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      this_00 = *ppMVar2;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffff80,
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffff80,
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      FabArrayBase::nComp((FabArrayBase *)this_00);
      in_stack_ffffffffffffff78 = FabArrayBase::nGrow((FabArrayBase *)this_00,0);
      PVar3 = Geometry::periodicity(&in_RDI->m_geom);
      local_40 = PVar3.period.vect[2];
      in_stack_ffffffffffffff80 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffffcc;
      FabArray<amrex::FArrayBox>::ParallelCopy
                ((FabArray<amrex::FArrayBox> *)in_RDX,
                 (FabArray<amrex::FArrayBox> *)CONCAT44(uVar5,uVar4),(int)((ulong)this_00 >> 0x20),
                 (int)this_00,local_40,PVar3.period.vect[1],unaff_retaddr,in_stack_00000008,
                 in_stack_00000010);
    }
  }
  return;
}

Assistant:

void
Level::fillFaceCent (Array<MultiFab*,AMREX_SPACEDIM> const& a_facecent, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_facecent[idim]->setVal(0.0);
    }
    if (!isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            auto& facecent = *a_facecent[idim];
            a_facecent[idim]->ParallelCopy(m_facecent[idim],0,0,facecent.nComp(),
                                           0,facecent.nGrow(),geom.periodicity());
        }
    }
}